

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastAdderCLA(Gia_Man_t *pNew,int *pAdd0,int *pAdd1,int nBits,int fSign,int CarryIn)

{
  size_t __n;
  uint uVar1;
  int *pAdd0_00;
  int *pAdd1_00;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  iVar2 = nBits;
  if (1 < (uint)nBits) {
    uVar1 = nBits - 1;
    if (uVar1 == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      iVar2 = iVar2 + 0x21;
    }
  }
  uVar1 = 1 << ((byte)iVar2 & 0x1f);
  pAdd0_00 = (int *)calloc((long)(int)uVar1,4);
  pAdd1_00 = (int *)calloc((long)(int)uVar1,4);
  if (nBits < 1) {
    uVar3 = 0;
  }
  else {
    __n = (ulong)(uint)nBits * 4;
    memcpy(pAdd0_00,pAdd0,__n);
    memcpy(pAdd1_00,pAdd1,__n);
    uVar3 = nBits;
  }
  if ((int)uVar3 < (int)uVar1) {
    uVar4 = (ulong)uVar3;
    do {
      if (fSign == 0) {
        pAdd0_00[uVar4] = 0;
        iVar2 = 0;
      }
      else {
        pAdd0_00[uVar4] = pAdd0[(long)nBits + -1];
        iVar2 = pAdd1[(long)nBits + -1];
      }
      pAdd1_00[uVar4] = iVar2;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  Wlc_BlastAdderCLA_int(pNew,pAdd0_00,pAdd1_00,uVar1,CarryIn);
  if (0 < nBits) {
    memcpy(pAdd0,pAdd0_00,(ulong)(uint)nBits << 2);
  }
  if (pAdd0_00 != (int *)0x0) {
    free(pAdd0_00);
  }
  if (pAdd1_00 != (int *)0x0) {
    free(pAdd1_00);
    return;
  }
  return;
}

Assistant:

void Wlc_BlastAdderCLA( Gia_Man_t * pNew, int * pAdd0, int * pAdd1, int nBits, int fSign, int CarryIn ) // result is in pAdd0
{
    int i, Log2 = Abc_Base2Log(nBits);
    int * pAdd0n = ABC_CALLOC( int, 1<<Log2 );
    int * pAdd1n = ABC_CALLOC( int, 1<<Log2 );
    for ( i = 0; i < nBits; i++ )
    {
        pAdd0n[i] = pAdd0[i];
        pAdd1n[i] = pAdd1[i];
    }
    for ( ; i < (1<<Log2); i++ )
    {
        pAdd0n[i] = fSign ? pAdd0[nBits-1] : 0;
        pAdd1n[i] = fSign ? pAdd1[nBits-1] : 0;
    }
    Wlc_BlastAdderCLA_int( pNew, pAdd0n, pAdd1n, 1<<Log2, CarryIn );
    for ( i = 0; i < nBits; i++ )
        pAdd0[i] = pAdd0n[i];
    ABC_FREE(pAdd0n);
    ABC_FREE(pAdd1n);
}